

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

uint __thiscall doctest::String::size(String *this)

{
  size_t sVar1;
  uint local_20;
  String *this_local;
  
  if (this->m_str == (char *)0x0) {
    local_20 = 0;
  }
  else {
    sVar1 = detail::my_strlen(this->m_str);
    local_20 = (uint)sVar1;
  }
  return local_20;
}

Assistant:

unsigned String::size() const { return m_str ? detail::my_strlen(m_str) : 0; }